

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

QMimeData * __thiscall QListModel::mimeData(QListModel *this,QModelIndexList *indexes)

{
  int iVar1;
  ulong uVar2;
  QListWidget *pQVar3;
  QMimeData *pQVar4;
  parameter_type t;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<QListWidgetItem_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = 0;
  local_48.d = (Data *)0x0;
  local_48.ptr = (QListWidgetItem **)0x0;
  uVar5 = (indexes->d).size;
  iVar1 = (int)uVar5;
  QList<QListWidgetItem_*>::reserve((QList<QListWidgetItem_*> *)&local_48,(long)iVar1);
  uVar6 = 0;
  uVar5 = uVar5 & 0xffffffff;
  if (iVar1 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 * 0x18 - uVar6 != 0; uVar6 = uVar6 + 0x18) {
    uVar2 = (ulong)*(int *)((long)&((indexes->d).ptr)->r + uVar6);
    if (uVar2 < (ulong)(this->items).d.size) {
      t = (this->items).d.ptr[uVar2];
    }
    else {
      t = (parameter_type)0x0;
    }
    QList<QListWidgetItem_*>::append((QList<QListWidgetItem_*> *)&local_48,t);
  }
  QArrayDataPointer<QModelIndex>::operator=(&(this->cachedIndexes).d,&indexes->d);
  pQVar3 = view(this);
  pQVar4 = (QMimeData *)
           (**(code **)(*(long *)&(pQVar3->super_QListView).super_QAbstractItemView.
                                  super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x308))
                     (pQVar3,&local_48);
  QList<QModelIndex>::clear(&this->cachedIndexes);
  QArrayDataPointer<QListWidgetItem_*>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QListModel::mimeData(const QModelIndexList &indexes) const
{
    QList<QListWidgetItem*> itemlist;
    const int indexesCount = indexes.size();
    itemlist.reserve(indexesCount);
    for (int i = 0; i < indexesCount; ++i)
        itemlist << at(indexes.at(i).row());

    cachedIndexes = indexes;
    QMimeData *mimeData = view()->mimeData(itemlist);
    cachedIndexes.clear();
    return mimeData;
}